

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_DXT.c
# Opt level: O2

void LSE_master_colors_max_min(int *cmax,int *cmin,int channels,uchar *uncompressed)

{
  int iVar1;
  int iVar2;
  int iVar3;
  byte *pbVar4;
  uint uVar5;
  long lVar6;
  bool bVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float sum_x [3];
  int c1 [3];
  int c0 [3];
  float sum_x2 [3];
  
  sum_x[2] = 0.0;
  sum_x[0] = 0.0;
  sum_x[1] = 0.0;
  sum_x2[2] = 0.0;
  sum_x2[0] = 0.0;
  sum_x2[1] = 0.0;
  if (0xfffffffd < channels - 5U) {
    compute_color_line_STDEV(uncompressed,channels,sum_x,sum_x2);
    fVar8 = (float)uncompressed[2] * sum_x2[2] +
            (float)*uncompressed * sum_x2[0] + (float)uncompressed[1] * sum_x2[1];
    pbVar4 = uncompressed + 2;
    lVar6 = 0xf;
    fVar10 = fVar8;
    while( true ) {
      fVar9 = fVar10;
      pbVar4 = pbVar4 + (uint)channels;
      bVar7 = lVar6 == 0;
      lVar6 = lVar6 + -1;
      if (bVar7) break;
      fVar11 = (float)*pbVar4 * sum_x2[2] +
               (float)pbVar4[-2] * sum_x2[0] + (float)pbVar4[-1] * sum_x2[1];
      fVar10 = fVar11;
      if ((fVar9 <= fVar11) && (fVar10 = fVar9, fVar8 < fVar11)) {
        fVar8 = fVar11;
      }
    }
    fVar11 = 1.0 / (sum_x2[2] * sum_x2[2] + sum_x2[1] * sum_x2[1] + sum_x2[0] * sum_x2[0] + 1e-05);
    fVar10 = sum_x2[2] * sum_x[2] + sum_x2[0] * sum_x[0] + sum_x2[1] * sum_x[1];
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      uVar5 = (uint)((fVar8 - fVar10) * fVar11 * sum_x2[lVar6] + sum_x[lVar6] + 0.5);
      c0[lVar6] = uVar5;
      if ((int)uVar5 < 0) {
        iVar3 = 0;
LAB_00160152:
        c0[lVar6] = iVar3;
      }
      else {
        iVar3 = 0xff;
        if (0xff < uVar5) goto LAB_00160152;
      }
      uVar5 = (uint)(sum_x2[lVar6] * (fVar9 - fVar10) * fVar11 + sum_x[lVar6] + 0.5);
      c1[lVar6] = uVar5;
      if ((int)uVar5 < 0) {
        iVar3 = 0;
LAB_0016017b:
        c1[lVar6] = iVar3;
      }
      else {
        iVar3 = 0xff;
        if (0xff < uVar5) goto LAB_0016017b;
      }
    }
    iVar1 = rgb_to_565(c0[0],c0[1],c0[2]);
    iVar2 = rgb_to_565(c1[0],c1[1],c1[2]);
    iVar3 = iVar2;
    if (iVar2 < iVar1) {
      iVar3 = iVar1;
    }
    if (iVar1 < iVar2) {
      iVar2 = iVar1;
    }
    *cmax = iVar3;
    *cmin = iVar2;
  }
  return;
}

Assistant:

void LSE_master_colors_max_min(
		int *cmax, int *cmin,
		int channels,
		const unsigned char *const uncompressed )
{
	int i, j;
	/*	the master colors	*/
	int c0[3], c1[3];
	/*	used for fitting the line	*/
	float sum_x[] = { 0.0f, 0.0f, 0.0f };
	float sum_x2[] = { 0.0f, 0.0f, 0.0f };
	float dot_max = 1.0f, dot_min = -1.0f;
	float vec_len2 = 0.0f;
	float dot;
	/*	error check	*/
	if( (channels < 3) || (channels > 4) )
	{
		return;
	}
	compute_color_line_STDEV( uncompressed, channels, sum_x, sum_x2 );
	vec_len2 = 1.0f / ( 0.00001f +
			sum_x2[0]*sum_x2[0] + sum_x2[1]*sum_x2[1] + sum_x2[2]*sum_x2[2] );
	/*	finding the max and min vector values	*/
	dot_max =
			(
				sum_x2[0] * uncompressed[0] +
				sum_x2[1] * uncompressed[1] +
				sum_x2[2] * uncompressed[2]
			);
	dot_min = dot_max;
	for( i = 1; i < 16; ++i )
	{
		dot =
			(
				sum_x2[0] * uncompressed[i*channels+0] +
				sum_x2[1] * uncompressed[i*channels+1] +
				sum_x2[2] * uncompressed[i*channels+2]
			);
		if( dot < dot_min )
		{
			dot_min = dot;
		} else if( dot > dot_max )
		{
			dot_max = dot;
		}
	}
	/*	and the offset (from the average location)	*/
	dot = sum_x2[0]*sum_x[0] + sum_x2[1]*sum_x[1] + sum_x2[2]*sum_x[2];
	dot_min -= dot;
	dot_max -= dot;
	/*	post multiply by the scaling factor	*/
	dot_min *= vec_len2;
	dot_max *= vec_len2;
	/*	OK, build the master colors	*/
	for( i = 0; i < 3; ++i )
	{
		/*	color 0	*/
		c0[i] = (int)(0.5f + sum_x[i] + dot_max * sum_x2[i]);
		if( c0[i] < 0 )
		{
			c0[i] = 0;
		} else if( c0[i] > 255 )
		{
			c0[i] = 255;
		}
		/*	color 1	*/
		c1[i] = (int)(0.5f + sum_x[i] + dot_min * sum_x2[i]);
		if( c1[i] < 0 )
		{
			c1[i] = 0;
		} else if( c1[i] > 255 )
		{
			c1[i] = 255;
		}
	}
	/*	down_sample (with rounding?)	*/
	i = rgb_to_565( c0[0], c0[1], c0[2] );
	j = rgb_to_565( c1[0], c1[1], c1[2] );
	if( i > j )
	{
		*cmax = i;
		*cmin = j;
	} else
	{
		*cmax = j;
		*cmin = i;
	}
}